

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_map_test.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::
NoFieldPresenceMapSerializeTest_MapRoundTripZeroKeyZeroEnum_Test<absl::lts_20250127::Cord>::
~NoFieldPresenceMapSerializeTest_MapRoundTripZeroKeyZeroEnum_Test
          (NoFieldPresenceMapSerializeTest_MapRoundTripZeroKeyZeroEnum_Test<absl::lts_20250127::Cord>
           *this)

{
  NoFieldPresenceMapSerializeTest_MapRoundTripZeroKeyZeroEnum_Test<absl::lts_20250127::Cord>
  *this_local;
  
  ~NoFieldPresenceMapSerializeTest_MapRoundTripZeroKeyZeroEnum_Test(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TYPED_TEST(NoFieldPresenceMapSerializeTest, MapRoundTripZeroKeyZeroEnum) {
  TestAllMapTypes msg;
  ASSERT_EQ(static_cast<uint32_t>(FOREIGN_FOO), 0);
  (*msg.mutable_map_int32_foreign_enum())[0] = FOREIGN_FOO;

  // Test that message can serialize.
  TypeParam& output_sink = this->GetOutputSinkRef();
  ASSERT_TRUE(TestSerialize(msg, &output_sink));
  // Maps with zero key or value fields are still serialized.
  ASSERT_FALSE(this->GetOutput().empty());

  // Test that message can roundtrip.
  TestAllMapTypes rt_msg;
  EXPECT_TRUE(rt_msg.ParseFromString(this->GetOutput()));
  EXPECT_THAT(rt_msg.map_int32_foreign_enum(),
              UnorderedPointwise(Eq(), msg.map_int32_foreign_enum()));

  // The map behaviour is pretty much the same whether the key/value field is
  // zero or not.
  EXPECT_EQ(FOREIGN_FOO, rt_msg.map_int32_foreign_enum().at(0));
}